

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_getchar.c
# Opt level: O1

int mpt_parse_getchar(mpt_parser_input *src,mpt_path *path)

{
  int val;
  int iVar1;
  
  if (src->line == 0) {
    src->line = 1;
  }
  val = (*src->getc)(src->arg);
  if (0 < val) {
    if (val == 10) {
      src->line = src->line + 1;
    }
    if (path != (mpt_path *)0x0) {
      iVar1 = mpt_path_addchar(path,val);
      if (iVar1 < 0) {
        val = -1;
      }
    }
  }
  return val;
}

Assistant:

extern int mpt_parse_getchar(MPT_STRUCT(parser_input) *src, MPT_STRUCT(path) *path)
{
	int curr;
	
	if (!src->line) ++src->line;
	
	if ((curr = src->getc(src->arg)) <= 0) {
		return curr;
	}
	if (curr == '\n') {
		src->line++;
	}
	if (path && mpt_path_addchar(path, curr) < 0) {
		return -1;
	}
	return curr;
}